

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

bool duckdb::VectorCastHelpers::ToDecimalCast<unsigned_int>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  PhysicalType PVar1;
  InternalException *this;
  uint8_t width;
  uint8_t scale;
  bool bVar2;
  allocator local_51;
  string local_50;
  
  width = DecimalType::GetWidth(&result->type);
  scale = DecimalType::GetScale(&result->type);
  PVar1 = (result->type).physical_type_;
  if (PVar1 == INT128) {
    bVar2 = TemplatedDecimalCast<unsigned_int,duckdb::hugeint_t,duckdb::TryCastToDecimal>
                      (source,result,count,parameters,width,scale);
    return bVar2;
  }
  if (PVar1 == INT32) {
    bVar2 = TemplatedDecimalCast<unsigned_int,int,duckdb::TryCastToDecimal>
                      (source,result,count,parameters,width,scale);
    return bVar2;
  }
  if (PVar1 == INT64) {
    bVar2 = TemplatedDecimalCast<unsigned_int,long,duckdb::TryCastToDecimal>
                      (source,result,count,parameters,width,scale);
    return bVar2;
  }
  if (PVar1 == INT16) {
    bVar2 = TemplatedDecimalCast<unsigned_int,short,duckdb::TryCastToDecimal>
                      (source,result,count,parameters,width,scale);
    return bVar2;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Unimplemented internal type for decimal",&local_51);
  InternalException::InternalException(this,&local_50);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static bool ToDecimalCast(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
		auto &result_type = result.GetType();
		auto width = DecimalType::GetWidth(result_type);
		auto scale = DecimalType::GetScale(result_type);
		switch (result_type.InternalType()) {
		case PhysicalType::INT16:
			return TemplatedDecimalCast<T, int16_t, TryCastToDecimal>(source, result, count, parameters, width, scale);
		case PhysicalType::INT32:
			return TemplatedDecimalCast<T, int32_t, TryCastToDecimal>(source, result, count, parameters, width, scale);
		case PhysicalType::INT64:
			return TemplatedDecimalCast<T, int64_t, TryCastToDecimal>(source, result, count, parameters, width, scale);
		case PhysicalType::INT128:
			return TemplatedDecimalCast<T, hugeint_t, TryCastToDecimal>(source, result, count, parameters, width,
			                                                            scale);
		default:
			throw InternalException("Unimplemented internal type for decimal");
		}
	}